

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O0

bool __thiscall leveldb::FindFileTest::Overlaps(FindFileTest *this,char *smallest,char *largest)

{
  bool bVar1;
  Comparator *c;
  Slice *local_90;
  Slice *local_80;
  char *local_68;
  char *local_60;
  undefined1 local_50 [8];
  Slice l;
  Slice s;
  InternalKeyComparator cmp;
  char *largest_local;
  char *smallest_local;
  FindFileTest *this_local;
  
  c = BytewiseComparator();
  InternalKeyComparator::InternalKeyComparator((InternalKeyComparator *)&s.size_,c);
  local_60 = smallest;
  if (smallest == (char *)0x0) {
    local_60 = "";
  }
  Slice::Slice((Slice *)&l.size_,local_60);
  local_68 = largest;
  if (largest == (char *)0x0) {
    local_68 = "";
  }
  Slice::Slice((Slice *)local_50,local_68);
  if (smallest == (char *)0x0) {
    local_80 = (Slice *)0x0;
  }
  else {
    local_80 = (Slice *)&l.size_;
  }
  if (largest == (char *)0x0) {
    local_90 = (Slice *)0x0;
  }
  else {
    local_90 = (Slice *)local_50;
  }
  bVar1 = SomeFileOverlapsRange
                    ((InternalKeyComparator *)&s.size_,(bool)(this->disjoint_sorted_files_ & 1),
                     &this->files_,local_80,local_90);
  InternalKeyComparator::~InternalKeyComparator((InternalKeyComparator *)&s.size_);
  return bVar1;
}

Assistant:

bool Overlaps(const char* smallest, const char* largest) {
    InternalKeyComparator cmp(BytewiseComparator());
    Slice s(smallest != nullptr ? smallest : "");
    Slice l(largest != nullptr ? largest : "");
    return SomeFileOverlapsRange(cmp, disjoint_sorted_files_, files_,
                                 (smallest != nullptr ? &s : nullptr),
                                 (largest != nullptr ? &l : nullptr));
  }